

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.cpp
# Opt level: O2

bool __thiscall
LdConfigDirWrapper::wrapSubentriesTable
          (LdConfigDirWrapper *this,size_t parentFieldId,size_t counterFieldId)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  LdConfigEntryWrapper *this_00;
  undefined4 extraout_var_00;
  vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *this_01;
  size_t entryNumber;
  bool isOk;
  key_type_conflict2 local_4c;
  LdConfigEntryWrapper *local_48;
  map<unsigned_int,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>_>_>
  *local_40;
  vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *local_38;
  
  isOk = false;
  iVar1 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x1c])
                    (this,counterFieldId,0xffffffffffffffff,&isOk);
  if (isOk == true) {
    local_38 = (vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
               &(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.entries;
    local_40 = &this->subEntriesMap;
    for (entryNumber = 0; CONCAT44(extraout_var,iVar1) != entryNumber; entryNumber = entryNumber + 1
        ) {
      this_00 = (LdConfigEntryWrapper *)operator_new(0x48);
      LdConfigEntryWrapper::LdConfigEntryWrapper
                (this_00,(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                         super_ExeElementWrapper.m_Exe,this,entryNumber,parentFieldId);
      iVar2 = (*(this_00->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                _vptr_AbstractByteBuffer[0xc])(this_00);
      if (CONCAT44(extraout_var_00,iVar2) == 0) {
        (*(this_00->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
          _vptr_AbstractByteBuffer[1])(this_00);
        return isOk;
      }
      local_48 = this_00;
      std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                (local_38,(ExeNodeWrapper **)&local_48);
      local_4c = (key_type_conflict2)parentFieldId;
      this_01 = (vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>> *)
                std::
                map<unsigned_int,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>_>_>_>
                ::operator[](local_40,&local_4c);
      local_48 = this_00;
      std::vector<ExeNodeWrapper*,std::allocator<ExeNodeWrapper*>>::emplace_back<ExeNodeWrapper*>
                (this_01,(ExeNodeWrapper **)&local_48);
    }
  }
  else {
    isOk = false;
  }
  return isOk;
}

Assistant:

bool LdConfigDirWrapper::wrapSubentriesTable(size_t parentFieldId, size_t counterFieldId)
{
    bool isOk = false;
    size_t count = this->getNumValue(counterFieldId, &isOk);
    if (!isOk) {
        return false;
    }
    for (size_t i = 0 ; i < count; i++) {
        LdConfigEntryWrapper *entry = new LdConfigEntryWrapper(m_Exe, this, i, parentFieldId);
        if (!entry || !entry->getPtr()) {
            delete entry;
            break;
        }
        this->entries.push_back(entry);
        this->subEntriesMap[parentFieldId].push_back(entry);
    }
    return isOk;
}